

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GPUShaderFP64Test5::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test5 *this,_test_case *test_case)

{
  _variable_type _Var1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  GPUShaderFP64Test5 *pGVar5;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  char *pcVar6;
  ulong uVar7;
  uint swizzle_n_components;
  string src_type_string;
  string swizzle_string;
  string dst_type_string;
  string base_type_string;
  uint swizzle_component_order [4];
  stringstream result;
  uint local_264;
  string *local_260;
  ulong local_258;
  GPUShaderFP64Test5 *local_250;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  uint local_1c8 [4];
  stringstream local_1b8 [16];
  GPUShaderFP64Test5 local_1a8;
  
  local_260 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  _Var1 = Utils::getBaseVariableType(test_case->src_type);
  Utils::getVariableTypeString_abi_cxx11_(&local_1e8,(Utils *)(ulong)_Var1,type);
  Utils::getVariableTypeString_abi_cxx11_(&local_208,(Utils *)(ulong)test_case->dst_type,type_00);
  uVar2 = Utils::getNumberOfComponentsForVariableType(test_case->dst_type);
  uVar3 = Utils::getNumberOfComponentsForVariableType(test_case->src_type);
  local_258 = (ulong)uVar2;
  local_250 = this;
  Utils::getVariableTypeString_abi_cxx11_(&local_248,(Utils *)(ulong)test_case->src_type,type_01);
  std::operator<<((ostream *)&local_1a8,"#version 420\n\n");
  if (test_case->dst_type == VARIABLE_TYPE_BOOL) {
    pcVar6 = "out int result;\n";
    pGVar5 = &local_1a8;
  }
  else {
    poVar4 = std::operator<<((ostream *)&local_1a8,"out ");
    pGVar5 = (GPUShaderFP64Test5 *)std::operator<<(poVar4,(string *)&local_208);
    pcVar6 = " result;\n";
  }
  std::operator<<((ostream *)pGVar5,pcVar6);
  if (test_case->src_type == VARIABLE_TYPE_BOOL) {
    pcVar6 = "in int base_value;\n";
    pGVar5 = &local_1a8;
  }
  else {
    poVar4 = std::operator<<((ostream *)&local_1a8,"in ");
    pGVar5 = (GPUShaderFP64Test5 *)std::operator<<(poVar4,(string *)&local_1e8);
    pcVar6 = " base_value;\n";
  }
  std::operator<<((ostream *)pGVar5,pcVar6);
  poVar4 = std::operator<<((ostream *)&local_1a8,"void main()\n{\n");
  poVar4 = std::operator<<(poVar4,(string *)&local_248);
  std::operator<<(poVar4," lside_value = ");
  if (test_case->src_type == VARIABLE_TYPE_BOOL) {
    poVar4 = std::operator<<((ostream *)&local_1a8,(string *)&local_248);
    pcVar6 = "(0 != ";
  }
  else {
    poVar4 = std::operator<<((ostream *)&local_1a8,(string *)&local_248);
    pcVar6 = "(";
  }
  std::operator<<(poVar4,pcVar6);
  if (test_case->src_type == VARIABLE_TYPE_BOOL) {
    std::operator<<((ostream *)&local_1a8,"base_value");
  }
  else {
    for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      poVar4 = std::operator<<((ostream *)&local_1a8,"base_value + ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      if (uVar3 - 1 != uVar7) {
        std::operator<<((ostream *)&local_1a8,", ");
      }
    }
  }
  std::operator<<((ostream *)&local_1a8,");\n");
  pGVar5 = &local_1a8;
  if (test_case->dst_type == VARIABLE_TYPE_BOOL) {
    pcVar6 = "result = (lside_value == false) ? 0 : 1";
    if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
      pcVar6 = "result = (bool(lside_value) == false) ? 0 : 1";
    }
  }
  else if (test_case->type == TEST_CASE_TYPE_EXPLICIT) {
    poVar4 = std::operator<<((ostream *)&local_1a8,"result = ");
    pGVar5 = (GPUShaderFP64Test5 *)std::operator<<(poVar4,(string *)&local_208);
    pcVar6 = "(lside_value)";
  }
  else {
    pcVar6 = "result = lside_value";
  }
  std::operator<<((ostream *)pGVar5,pcVar6);
  if ((1 < uVar3) &&
     ((VARIABLE_TYPE_MAT4X3 < test_case->src_type ||
      ((0x7fc03fe0U >> (test_case->src_type & VARIABLE_TYPE_UINT) & 1) == 0)))) {
    local_264 = 0;
    local_1c8[0] = 0;
    local_1c8[1] = 0;
    local_1c8[2] = 0;
    local_1c8[3] = 0;
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    local_228._M_string_length = 0;
    local_228.field_2._M_local_buf[0] = '\0';
    getSwizzleTypeProperties
              (pGVar5,local_250->m_swizzle_matrix[(int)local_258 - 1][uVar3 - 1],&local_228,
               &local_264,local_1c8);
    if (local_264 != 0) {
      poVar4 = std::operator<<((ostream *)&local_1a8,".");
      std::operator<<(poVar4,(string *)&local_228);
    }
    std::__cxx11::string::~string((string *)&local_228);
  }
  std::operator<<((ostream *)&local_1a8,";\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return local_260;
}

Assistant:

std::string GPUShaderFP64Test5::getVertexShaderBody(const _test_case& test_case)
{
	std::stringstream  result;
	const std::string  base_type_string = Utils::getVariableTypeString(Utils::getBaseVariableType(test_case.src_type));
	const std::string  dst_type_string  = Utils::getVariableTypeString(test_case.dst_type);
	const unsigned int n_dst_components = Utils::getNumberOfComponentsForVariableType(test_case.dst_type);
	const unsigned int n_src_components = Utils::getNumberOfComponentsForVariableType(test_case.src_type);
	const std::string  src_type_string  = Utils::getVariableTypeString(test_case.src_type);

	/* Add version preamble */
	result << "#version 420\n"
			  "\n";

	/* Declare output variables. Note that boolean output variables are not supported, so we need
	 * to handle that special case correctly */
	if (test_case.dst_type == Utils::VARIABLE_TYPE_BOOL)
	{
		result << "out int result;\n";
	}
	else
	{
		result << "out " << dst_type_string << " result;\n";
	}

	/* Declare input variables. Handle the bool case exclusively. */
	if (test_case.src_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* Use ints for bools. We will cast them to bool in the code later. */
		result << "in int base_value;\n";
	}
	else
	{
		result << "in " << base_type_string << " base_value;\n";
	}

	/* Declare main() and construct the value we will be casting from.
	 *
	 * Note: Addition operations on bool values cause an implicit conversion to int
	 *       which is not allowed. Hence, we skip these operations for this special
	 *       case.
	 */
	result << "void main()\n"
			  "{\n"
		   << src_type_string << " lside_value = ";

	if (test_case.src_type == Utils::VARIABLE_TYPE_BOOL)
	{
		result << src_type_string << "(0 != ";
	}
	else
	{
		result << src_type_string << "(";
	}

	if (test_case.src_type != Utils::VARIABLE_TYPE_BOOL)
	{
		for (unsigned int n_component = 0; n_component < n_src_components; ++n_component)
		{
			result << "base_value + " << n_component;

			if (n_component != (n_src_components - 1))
			{
				result << ", ";
			}
		} /* for (all components) */
	}
	else
	{
		DE_ASSERT(n_src_components == 1);

		result << "base_value";
	}

	result << ");\n";

	/* Perform the casting operation. Add swizzle operator if possible. */
	if (test_case.dst_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* Handle the bool case exclusively */
		if (test_case.type == TEST_CASE_TYPE_EXPLICIT)
		{
			result << "result = (bool(lside_value) == false) ? 0 : 1";
		}
		else
		{
			result << "result = (lside_value == false) ? 0 : 1";
		}
	}
	else
	{
		if (test_case.type == TEST_CASE_TYPE_EXPLICIT)
		{
			result << "result = " << dst_type_string << "(lside_value)";
		}
		else
		{
			result << "result = lside_value";
		}
	}

	if (n_src_components > 1 && !Utils::isMatrixVariableType(test_case.src_type))
	{
		/* Add a swizzle operator  */
		DE_ASSERT(n_dst_components > 0 && n_dst_components <= 4);
		DE_ASSERT(n_src_components > 0 && n_src_components <= 4);

		unsigned int  swizzle_component_order[4] = { 0 };
		unsigned int  swizzle_n_components		 = 0;
		_swizzle_type swizzle_operator			 = m_swizzle_matrix[n_dst_components - 1][n_src_components - 1];
		std::string   swizzle_string;

		getSwizzleTypeProperties(swizzle_operator, &swizzle_string, &swizzle_n_components, swizzle_component_order);

		if (swizzle_n_components > 0)
		{
			result << "." << swizzle_string;
		}
	}

	/* Close the shader implementation. */
	result << ";\n"
			  "}\n";

	return result.str();
}